

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopy<duckdb::list_entry_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  vector<duckdb::VectorMetaData,_true> *this;
  ushort uVar1;
  ColumnDataCollectionSegment *pCVar2;
  ColumnDataAppendState *state;
  sel_t *psVar3;
  undefined8 uVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  bool bVar7;
  Vector *this_00;
  VectorMetaData *pVVar8;
  VectorDataIndex VVar9;
  VectorChildIndex VVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  ValidityMask *this_01;
  ColumnDataAllocator *pCVar14;
  data_ptr_t pdVar15;
  long lVar16;
  ulong uVar17;
  idx_t iVar18;
  idx_t iVar19;
  long lVar20;
  ulong uVar21;
  idx_t iVar22;
  idx_t local_190;
  ConsecutiveChildListInfo info;
  SelectionVector sel;
  Vector sliced_child_vector;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat child_vector_data;
  
  pCVar2 = meta_data->segment;
  this_00 = ListVector::GetEntry(source);
  pVVar8 = ColumnDataMetaData::GetVectorMetaData(meta_data);
  if ((pVVar8->child_index).index == 0xffffffffffffffff) {
    VVar9 = ColumnDataCollectionSegment::AllocateVector
                      (pCVar2,&this_00->type,meta_data->chunk_data,
                       &meta_data->state->current_chunk_state,(VectorDataIndex)0xffffffffffffffff);
    VVar10 = ColumnDataCollectionSegment::AddChildIndex(meta_data->segment,VVar9);
    pVVar8 = ColumnDataMetaData::GetVectorMetaData(meta_data);
    (pVVar8->child_index).index = VVar10.index;
  }
  iVar22 = 0;
  pvVar11 = vector<duckdb::ColumnDataCopyFunction,_true>::get<true>
                      (&meta_data->copy_function->child_functions,0);
  pVVar8 = ColumnDataMetaData::GetVectorMetaData(meta_data);
  pvVar12 = vector<duckdb::VectorDataIndex,_true>::get<true>
                      (&pCVar2->child_indices,(pVVar8->child_index).index);
  iVar19 = pvVar12->index;
  iVar18 = iVar19;
  while (iVar18 != 0xffffffffffffffff) {
    pvVar13 = vector<duckdb::VectorMetaData,_true>::get<true>(&pCVar2->vector_data,iVar18);
    iVar22 = iVar22 + pvVar13->count;
    iVar18 = (pvVar13->next_data).index;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&child_vector_data);
  local_a8.segment = meta_data->segment;
  local_a8.state = meta_data->state;
  local_a8.chunk_data = meta_data->chunk_data;
  local_a8.child_list_size = 0xffffffffffffffff;
  local_a8.copy_function = pvVar11;
  local_a8.vector_data_index.index = iVar19;
  ListVector::GetConsecutiveChildListInfo(&info,source,offset,copy_count);
  if (info.needs_slicing == true) {
    SelectionVector::SelectionVector(&sel,info.child_list_info.length);
    ListVector::GetConsecutiveChildSelVector(source,&sel,offset,copy_count);
    Vector::Vector(&sliced_child_vector,this_00,&sel,info.child_list_info.length);
    Vector::Flatten(&sliced_child_vector,info.child_list_info.length);
    info.child_list_info.offset = 0;
    Vector::ToUnifiedFormat(&sliced_child_vector,info.child_list_info.length,&child_vector_data);
    (*pvVar11->function)
              (&local_a8,&child_vector_data,&sliced_child_vector,info.child_list_info.offset,
               info.child_list_info.length);
    Vector::~Vector(&sliced_child_vector);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    Vector::ToUnifiedFormat(this_00,info.child_list_info.length,&child_vector_data);
    (*pvVar11->function)
              (&local_a8,&child_vector_data,this_00,info.child_list_info.offset,
               info.child_list_info.length);
  }
  meta_data->child_list_size = iVar22;
  pCVar2 = meta_data->segment;
  state = meta_data->state;
  VVar9.index = (meta_data->vector_data_index).index;
  this = &pCVar2->vector_data;
  this_01 = &source_data->validity;
  local_190 = offset;
  if (info.is_constant == true) {
    while (copy_count != 0) {
      pvVar13 = vector<duckdb::VectorMetaData,_true>::get<true>(this,VVar9.index);
      uVar17 = (ulong)(0x800 - pvVar13->count);
      if (copy_count <= uVar17) {
        uVar17 = copy_count;
      }
      pCVar14 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar2->allocator);
      pdVar15 = ColumnDataAllocator::GetDataPointer
                          (pCVar14,&state->current_chunk_state,pvVar13->block_id,pvVar13->offset);
      sliced_child_vector._0_8_ = pdVar15 + 0x8000;
      sliced_child_vector.type.id_ = INVALID;
      sliced_child_vector.type.physical_type_ = ~INVALID;
      sliced_child_vector.type._2_6_ = 0;
      sliced_child_vector.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sliced_child_vector.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      if (pvVar13->count == 0) {
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  ((TemplatedValidityMask<unsigned_long> *)&sliced_child_vector,0x800);
      }
      if ((this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        pSVar5 = source_data->sel;
        pdVar6 = source_data->data;
        uVar1 = pvVar13->count;
        iVar19 = local_190;
        for (lVar20 = 0; uVar17 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
          psVar3 = pSVar5->sel_vector;
          iVar18 = iVar19;
          if (psVar3 != (sel_t *)0x0) {
            iVar18 = (idx_t)psVar3[iVar19];
          }
          uVar4 = *(undefined8 *)(pdVar6 + iVar18 * 0x10 + 8);
          *(idx_t *)(pdVar15 + lVar20 + (ulong)uVar1 * 0x10) = meta_data->child_list_size;
          *(undefined8 *)(pdVar15 + lVar20 + (ulong)uVar1 * 0x10 + 8) = uVar4;
          iVar19 = iVar19 + 1;
        }
      }
      else {
        pdVar15 = pdVar15 + 8;
        for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
          psVar3 = source_data->sel->sel_vector;
          if (psVar3 == (sel_t *)0x0) {
            iVar19 = local_190 + uVar21;
          }
          else {
            iVar19 = (idx_t)psVar3[local_190 + uVar21];
          }
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_01->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar7) {
            uVar4 = *(undefined8 *)(source_data->data + iVar19 * 0x10 + 8);
            lVar20 = (ulong)pvVar13->count * 0x10;
            *(idx_t *)(pdVar15 + lVar20 + -8) = meta_data->child_list_size;
            *(undefined8 *)(pdVar15 + lVar20) = uVar4;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&sliced_child_vector,
                       pvVar13->count + uVar21);
          }
          pdVar15 = pdVar15 + 0x10;
        }
      }
      pvVar13->count = pvVar13->count + (short)uVar17;
      copy_count = copy_count - uVar17;
      if (copy_count != 0) {
        if ((pvVar13->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (pCVar2,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar9);
        }
        pvVar13 = vector<duckdb::VectorMetaData,_true>::get<true>(this,VVar9.index);
        VVar9.index = (pvVar13->next_data).index;
      }
      local_190 = local_190 + uVar17;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sliced_child_vector.type.type_info_)
      ;
    }
  }
  else {
    while (copy_count != 0) {
      pvVar13 = vector<duckdb::VectorMetaData,_true>::get<true>(this,VVar9.index);
      uVar17 = (ulong)(0x800 - pvVar13->count);
      if (copy_count <= uVar17) {
        uVar17 = copy_count;
      }
      pCVar14 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar2->allocator);
      pdVar15 = ColumnDataAllocator::GetDataPointer
                          (pCVar14,&state->current_chunk_state,pvVar13->block_id,pvVar13->offset);
      sliced_child_vector._0_8_ = pdVar15 + 0x8000;
      sliced_child_vector.type.id_ = INVALID;
      sliced_child_vector.type.physical_type_ = ~INVALID;
      sliced_child_vector.type._2_6_ = 0;
      sliced_child_vector.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sliced_child_vector.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      if (pvVar13->count == 0) {
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  ((TemplatedValidityMask<unsigned_long> *)&sliced_child_vector,0x800);
      }
      if ((this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        pSVar5 = source_data->sel;
        pdVar6 = source_data->data;
        uVar1 = pvVar13->count;
        iVar19 = local_190;
        for (lVar20 = 0; uVar17 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
          psVar3 = pSVar5->sel_vector;
          iVar18 = iVar19;
          if (psVar3 != (sel_t *)0x0) {
            iVar18 = (idx_t)psVar3[iVar19];
          }
          lVar16 = *(long *)(pdVar6 + iVar18 * 0x10 + 8);
          iVar18 = meta_data->child_list_size;
          meta_data->child_list_size = iVar18 + lVar16;
          *(idx_t *)(pdVar15 + lVar20 + (ulong)uVar1 * 0x10) = iVar18;
          *(long *)(pdVar15 + lVar20 + (ulong)uVar1 * 0x10 + 8) = lVar16;
          iVar19 = iVar19 + 1;
        }
      }
      else {
        pdVar15 = pdVar15 + 8;
        for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
          psVar3 = source_data->sel->sel_vector;
          if (psVar3 == (sel_t *)0x0) {
            iVar19 = local_190 + uVar21;
          }
          else {
            iVar19 = (idx_t)psVar3[local_190 + uVar21];
          }
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_01->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar7) {
            uVar1 = pvVar13->count;
            lVar20 = *(long *)(source_data->data + iVar19 * 0x10 + 8);
            iVar19 = meta_data->child_list_size;
            meta_data->child_list_size = iVar19 + lVar20;
            lVar16 = (ulong)uVar1 * 0x10;
            *(idx_t *)(pdVar15 + lVar16 + -8) = iVar19;
            *(long *)(pdVar15 + lVar16) = lVar20;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&sliced_child_vector,
                       pvVar13->count + uVar21);
          }
          pdVar15 = pdVar15 + 0x10;
        }
      }
      pvVar13->count = pvVar13->count + (short)uVar17;
      copy_count = copy_count - uVar17;
      if (copy_count != 0) {
        if ((pvVar13->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (pCVar2,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar9);
        }
        pvVar13 = vector<duckdb::VectorMetaData,_true>::get<true>(this,VVar9.index);
        VVar9.index = (pvVar13->next_data).index;
      }
      local_190 = local_190 + uVar17;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sliced_child_vector.type.type_info_)
      ;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&child_vector_data);
  return;
}

Assistant:

void ColumnDataCopy<list_entry_t>(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                                  idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	auto &child_vector = ListVector::GetEntry(source);
	auto &child_type = child_vector.GetType();

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	// figure out the current list size by traversing the set of child entries
	idx_t current_list_size = 0;
	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_list_size += child_vdata.count;
		current_child_index = child_vdata.next_data;
	}

	// set the child vector
	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	auto info = ListVector::GetConsecutiveChildListInfo(source, offset, copy_count);

	if (info.needs_slicing) {
		SelectionVector sel(info.child_list_info.length);
		ListVector::GetConsecutiveChildSelVector(source, sel, offset, copy_count);

		auto sliced_child_vector = Vector(child_vector, sel, info.child_list_info.length);
		sliced_child_vector.Flatten(info.child_list_info.length);
		info.child_list_info.offset = 0;

		sliced_child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, sliced_child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);

	} else {
		child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);
	}

	// now copy the list entries
	meta_data.child_list_size = current_list_size;
	if (info.is_constant) {
		TemplatedColumnDataCopy<ConstListValueCopy>(meta_data, source_data, source, offset, copy_count);
	} else {
		TemplatedColumnDataCopy<ListValueCopy>(meta_data, source_data, source, offset, copy_count);
	}
}